

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

Token * __thiscall Tokenizer::getNextHeaderToken(Token *__return_storage_ptr__,Tokenizer *this)

{
  char cVar1;
  ulong uVar2;
  size_type sVar3;
  pointer pcVar4;
  _Storage<char,_true> c;
  _Optional_base<char,_true,_true> _Var5;
  int iVar6;
  TokenizerException *pTVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  size_type sVar11;
  bool bVar12;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  byte local_28;
  
  _Var5._M_payload.super__Optional_payload_base<char> =
       (_Optional_payload<char,_true,_true,_true>)next(this);
  if (((ushort)_Var5._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
    pTVar7 = (TokenizerException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unexpected EOF while parsing HeaderBlock","");
    TokenizerException::TokenizerException
              (pTVar7,&local_68,this->line_number,this->col_number,&this->current_line);
    __cxa_throw(pTVar7,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
  }
  while( true ) {
    c._M_value = _Var5._M_payload.super__Optional_payload_base<char>._M_payload;
    iVar6 = isspace((int)c._M_value);
    if (iVar6 == 0) break;
    _Var5._M_payload.super__Optional_payload_base<char> =
         (_Optional_payload<char,_true,_true,_true>)next(this);
    if (((ushort)_Var5._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
      pTVar7 = (TokenizerException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Unexpected EOF while parsing HeaderBlock","");
      TokenizerException::TokenizerException
                (pTVar7,&local_68,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar7,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (c._M_value != ':') {
    if (((ushort)_Var5._M_payload.super__Optional_payload_base<char> & 0xff) != 0x5d)
    goto LAB_0010749d;
    uVar8 = (ulong)this->pos;
    uVar2 = (this->program)._M_string_length;
    if (uVar8 < uVar2) {
      uVar9 = (byte)(this->program)._M_dataplus._M_p[uVar8] | 0x100;
    }
    else {
      uVar9 = 0;
    }
    if (uVar9 >> 8 == 0) {
      pTVar7 = (TokenizerException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Unexpected EOF while parsing HeaderBlock","");
      TokenizerException::TokenizerException
                (pTVar7,&local_68,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar7,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((char)uVar9 == ']') {
      sVar3 = (this->header_block_name)._M_string_length;
      pcVar10 = (this->header_block_name)._M_dataplus._M_p;
      sVar11 = sVar3;
      do {
        uVar8 = uVar8 + 1;
        bVar12 = sVar11 == 0;
        sVar11 = sVar11 - 1;
        if (bVar12) {
          iVar6 = (int)sVar3 + 1;
          do {
            next(this);
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
          this->parsingHeaderBlock = false;
          local_48[0] = local_38;
          pcVar4 = (this->header_block_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_48,pcVar4,pcVar4 + (this->header_block_name)._M_string_length);
          local_28 = 2;
          __return_storage_ptr__->type = HeaderCloser;
          std::__detail::__variant::
          _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
          ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                             *)&__return_storage_ptr__->value,
                            (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                             *)local_48);
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
            ::_S_vtable._M_arr[local_28]._M_data)
                    ((anon_class_1_0_00000001 *)&local_68,
                     (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                      *)local_48);
          return __return_storage_ptr__;
        }
        if (uVar8 < uVar2) {
          uVar9 = (byte)(this->program)._M_dataplus._M_p[uVar8] | 0x100;
        }
        else {
          uVar9 = 0;
        }
        if (uVar9 >> 8 == 0) {
          pTVar7 = (TokenizerException *)__cxa_allocate_exception(0x10);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"Unexpected EOF while parsing HeaderBlock","");
          TokenizerException::TokenizerException
                    (pTVar7,&local_68,this->line_number,this->col_number,&this->current_line);
          __cxa_throw(pTVar7,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
        }
        cVar1 = *pcVar10;
        pcVar10 = pcVar10 + 1;
      } while (cVar1 == (char)uVar9);
    }
    if (c._M_value != ':') goto LAB_0010749d;
  }
  if ((this->program)._M_string_length <= (ulong)(long)this->pos) {
    pTVar7 = (TokenizerException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unexpected EOF while parsing HeaderBlock","");
    TokenizerException::TokenizerException
              (pTVar7,&local_68,this->line_number,this->col_number,&this->current_line);
    __cxa_throw(pTVar7,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this->program)._M_dataplus._M_p[this->pos] != ':') {
    __return_storage_ptr__->type = Colon;
    *(undefined4 *)
     &(__return_storage_ptr__->value).
      super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      .super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>._M_u =
         0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
             .super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
             super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
             super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
             super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
             super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
     + 0x20) = '\0';
    return __return_storage_ptr__;
  }
  next(this);
LAB_0010749d:
  if ((this->currentToken).type == Colon) {
    parseHeaderValue(__return_storage_ptr__,this,c._M_value);
  }
  else {
    parseHeaderKey(__return_storage_ptr__,this,c._M_value);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::getNextHeaderToken() {
    char c;
    optional<char> _;
    // Get next char of program
    _ = next();
    if (!_.has_value()) {
        throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number, current_line);
    }
    c = _.value();

    // Ignore whitespace
    while (isspace(c)) {
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number, current_line);
        }
        c = _.value();
    }

    if (c == ']') {
        _ = peek();
        if (!_.has_value()) {
            throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number, current_line);
        } else if (_.value() == ']') {
            int i;
            bool matches = true;
            for (i = 0; i < header_block_name.length(); i++) {
                _ = peek(1 + i);
                if (!_.has_value()) {
                    throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number,
                                             current_line);
                }
                if (_.value() != header_block_name[i]) {
                    matches = false;
                    break;
                }
            }
            if (matches) {
                next(1 + i);
                parsingHeaderBlock = false;
                return Token(HeaderCloser, header_block_name);
            }
        }
    }
    if (c == ':') {
        _ = peek();
        if (!_.has_value())
            throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number, current_line);
        if (_.value() != ':') {
            return Token(Colon);
        } else {
            next();
        }
    }
    if (currentToken.type == Colon) {
        return parseHeaderValue(c);
    } else {
        return parseHeaderKey(c);
    }
}